

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::PushMessage(CConnman *this,CNode *pnode,CSerializedNetMsg *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_Transport_*,_false> _Var2;
  pointer puVar3;
  pointer puVar4;
  string_view source_file;
  bool bVar5;
  int iVar6;
  Logger *pLVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  long *in_R9;
  size_t sVar9;
  long in_FS_OFFSET;
  pair<unsigned_long,_bool> pVar11;
  string_view str;
  string_view logging_function;
  size_t nMessageSize;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock103;
  string log_msg;
  unsigned_long local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [2];
  undefined1 local_98 [32];
  string local_78;
  string local_58;
  long local_38;
  long lVar10;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8[0]._M_dataplus._M_p =
       (pointer)((msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish +
                -(long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  pLVar7 = LogInstance();
  bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
  if (bVar5) {
    local_f0 = pnode->id;
    pLVar7 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar7);
    if (bVar5) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<std::__cxx11::string,unsigned_long,long>
                (&local_78,(tinyformat *)"sending %s (%d bytes) peer=%d\n",(char *)&msg->m_type,
                 local_e8,&local_f0,in_R9);
      PushMessage();
      pLVar7 = LogInstance();
      local_98._0_8_ = &DAT_00000050;
      local_98._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function._M_str = "PushMessage";
      logging_function._M_len = 0xb;
      BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0xefd,NET,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-capturemessages","");
  bVar5 = ArgsManager::GetBoolArg(&gArgs,&local_58,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (bVar5) {
    local_58._M_dataplus._M_p =
         (pointer)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_58._M_string_length =
         (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)local_58._M_dataplus._M_p;
    local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
    if (CaptureMessage_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar8 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar8);
        }
      }
      goto LAB_001b3dd0;
    }
    (*CaptureMessage_abi_cxx11_._M_invoker)
              ((_Any_data *)&CaptureMessage_abi_cxx11_,&pnode->addr,&msg->m_type,
               (Span<const_unsigned_char> *)&local_58,(bool *)local_98);
  }
  local_98._0_8_ = &pnode->cs_vSend;
  local_98._8_8_ = local_98._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_98);
  _Var2._M_head_impl =
       (pnode->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
  (*(_Var2._M_head_impl)->_vptr_Transport[7])(&local_58,_Var2._M_head_impl,1);
  if (local_58.field_2._8_8_ == 0) {
    bVar5 = (pnode->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (pnode->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  }
  else {
    bVar5 = false;
  }
  puVar3 = (msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar4 = (msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = 0x38;
  if (puVar3 != puVar4) {
    lVar10 = ((ulong)(puVar3 + (0x1f - (long)puVar4)) & 0xfffffffffffffff0) + 0x38;
  }
  sVar9 = lVar10 + pnode->m_send_memusage;
  pnode->m_send_memusage = sVar9;
  iVar6 = (*((pnode->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[9])();
  if ((ulong)this->nSendBufferMaxSize < CONCAT44(extraout_var,iVar6) + sVar9) {
    LOCK();
    (pnode->fPauseSend)._M_base._M_i = true;
    UNLOCK();
  }
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::emplace_back<CSerializedNetMsg>
            (&pnode->vSendMsg,msg);
  if ((bVar5) && ((char)local_58._M_string_length == '\x01')) {
    pVar11 = SocketSendData(this,pnode);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
    if (pVar11.first != 0) {
      RecordBytesSent(this,pVar11.first);
    }
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001b3dd0:
  __stack_chk_fail();
}

Assistant:

void CConnman::PushMessage(CNode* pnode, CSerializedNetMsg&& msg)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    size_t nMessageSize = msg.data.size();
    LogDebug(BCLog::NET, "sending %s (%d bytes) peer=%d\n", msg.m_type, nMessageSize, pnode->GetId());
    if (gArgs.GetBoolArg("-capturemessages", false)) {
        CaptureMessage(pnode->addr, msg.m_type, msg.data, /*is_incoming=*/false);
    }

    TRACE6(net, outbound_message,
        pnode->GetId(),
        pnode->m_addr_name.c_str(),
        pnode->ConnectionTypeAsString().c_str(),
        msg.m_type.c_str(),
        msg.data.size(),
        msg.data.data()
    );

    size_t nBytesSent = 0;
    {
        LOCK(pnode->cs_vSend);
        // Check if the transport still has unsent bytes, and indicate to it that we're about to
        // give it a message to send.
        const auto& [to_send, more, _msg_type] =
            pnode->m_transport->GetBytesToSend(/*have_next_message=*/true);
        const bool queue_was_empty{to_send.empty() && pnode->vSendMsg.empty()};

        // Update memory usage of send buffer.
        pnode->m_send_memusage += msg.GetMemoryUsage();
        if (pnode->m_send_memusage + pnode->m_transport->GetSendMemoryUsage() > nSendBufferMaxSize) pnode->fPauseSend = true;
        // Move message to vSendMsg queue.
        pnode->vSendMsg.push_back(std::move(msg));

        // If there was nothing to send before, and there is now (predicted by the "more" value
        // returned by the GetBytesToSend call above), attempt "optimistic write":
        // because the poll/select loop may pause for SELECT_TIMEOUT_MILLISECONDS before actually
        // doing a send, try sending from the calling thread if the queue was empty before.
        // With a V1Transport, more will always be true here, because adding a message always
        // results in sendable bytes there, but with V2Transport this is not the case (it may
        // still be in the handshake).
        if (queue_was_empty && more) {
            std::tie(nBytesSent, std::ignore) = SocketSendData(*pnode);
        }
    }
    if (nBytesSent) RecordBytesSent(nBytesSent);
}